

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void doDecodeScan(exr_context_t f,pixels *p,int xs,int ys)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  ostream *poVar9;
  char *pcVar10;
  size_t sVar11;
  undefined4 in_register_0000000c;
  char *pcVar12;
  char **ptr_00;
  long lVar13;
  long lVar14;
  exr_attr_box2i_t dw;
  int32_t linestride;
  int32_t pixelstride;
  exr_storage_t stortype;
  int32_t scansperchunk;
  void *ptr;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int32_t local_290;
  int local_28c;
  int local_288;
  int local_284;
  ulong local_280;
  exr_context_t local_278;
  char *local_270;
  char local_268 [64];
  char local_228 [8];
  long local_220;
  short local_218;
  
  pcVar12 = (char *)CONCAT44(in_register_0000000c,ys);
  iVar5 = exr_get_data_window(f,0,&local_2a0);
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
    pcVar10 = (char *)exr_get_default_error_message(iVar5);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, 0, &dw)",(char *)0x38f,0x182894,pcVar12);
  }
  if (local_2a0 != xs * 0x11) {
    core_test_fail("dw.min.x == IMG_DATA_X * xs",(char *)0x390,0x182894,pcVar12);
  }
  if (local_298 != xs * 0x56c + -1) {
    core_test_fail("dw.max.x == IMG_DATA_X * xs + IMG_WIDTH * xs - 1",(char *)0x391,0x182894,pcVar12
                  );
  }
  if (local_29c != ys * 0x1d) {
    core_test_fail("dw.min.y == IMG_DATA_Y * ys",(char *)0x392,0x182894,pcVar12);
  }
  if (local_294 != ys * 0xbc + -1) {
    core_test_fail("dw.max.y == IMG_DATA_Y * ys + IMG_HEIGHT * ys - 1",(char *)0x393,0x182894,
                   pcVar12);
  }
  iVar5 = exr_get_scanlines_per_chunk(f,0,&local_284);
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
    pcVar10 = (char *)exr_get_default_error_message(iVar5);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &scansperchunk)",(char *)0x395,0x182894,
                   pcVar12);
  }
  iVar5 = exr_get_storage(f,0,&local_288);
  if (iVar5 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
    pcVar10 = (char *)exr_get_default_error_message(iVar5);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    core_test_fail("exr_get_storage (f, 0, &stortype)",(char *)0x398,0x182894,pcVar12);
  }
  if (local_288 == 0) {
    if (local_29c <= local_294) {
      bVar2 = true;
      iVar5 = local_29c;
      local_280 = (ulong)(uint)ys;
      local_278 = f;
      do {
        uVar3 = local_280;
        pcVar12 = local_268;
        iVar6 = exr_read_scanline_chunk_info(f,0,iVar5);
        if (iVar6 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
          pcVar10 = (char *)exr_get_default_error_message(iVar6);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          core_test_fail("exr_read_scanline_chunk_info (f, 0, y, &cinfo)",(char *)0x39e,0x182894,
                         pcVar12);
        }
        if (bVar2) {
          pcVar12 = local_228;
          iVar6 = exr_decoding_initialize(f,0,local_268);
          if (iVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
            pcVar10 = (char *)exr_get_default_error_message(iVar6);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x3a2,0x182894
                           ,pcVar12);
          }
        }
        else {
          pcVar12 = local_228;
          iVar6 = exr_decoding_update(f,0,local_268);
          if (iVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
            pcVar10 = (char *)exr_get_default_error_message(iVar6);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            core_test_fail("exr_decoding_update (f, 0, &cinfo, &decoder)",(char *)0x3a6,0x182894,
                           pcVar12);
          }
        }
        iVar6 = iVar5 - local_29c;
        if (0 < local_218) {
          iVar1 = p->_stride_x;
          lVar14 = 0;
          lVar13 = 0;
          do {
            lVar4 = local_220;
            if (*(int *)(local_220 + 8 + lVar14) == 0) {
              *(undefined8 *)(local_220 + 0x28 + lVar14) = 0;
              *(undefined4 *)(local_220 + 0x20 + lVar14) = 0;
              iVar8 = 0;
            }
            else {
              ptr_00 = &local_270;
              fill_pointers(p,(exr_coding_channel_info_t *)(lVar14 + local_220),
                            (iVar6 / (int)uVar3) * iVar1,ptr_00,&local_28c,&local_290);
              iVar7 = (int)*(short *)(lVar4 + 0x1c + lVar14);
              if (local_28c != iVar7) {
                core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x3bd,
                               0x182894,(char *)ptr_00);
              }
              *(char **)(local_220 + 0x28 + lVar14) = local_270;
              *(int *)(local_220 + 0x20 + lVar14) = iVar7;
              pcVar12 = local_270;
              iVar8 = local_290;
            }
            *(int32_t *)(local_220 + 0x24 + lVar14) = iVar8;
            lVar13 = lVar13 + 1;
            lVar14 = lVar14 + 0x30;
          } while (lVar13 < local_218);
        }
        f = local_278;
        if (bVar2) {
          iVar6 = exr_decoding_choose_default_routines(local_278,0,local_228);
          if (iVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
            pcVar10 = (char *)exr_get_default_error_message(iVar6);
            if (pcVar10 == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x3c7,
                           0x182894,pcVar12);
          }
        }
        iVar6 = exr_decoding_run(f,0,local_228);
        if (iVar6 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
          pcVar10 = (char *)exr_get_default_error_message(iVar6);
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x3c9,0x182894,pcVar12);
        }
        iVar5 = iVar5 + local_284;
        bVar2 = false;
      } while (iVar5 <= local_294);
    }
    iVar5 = exr_decoding_destroy(f,local_228);
    if (iVar5 == 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") ",2);
    pcVar10 = (char *)exr_get_default_error_message(iVar5);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar10,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x3cd,0x182894,pcVar12);
  }
  core_test_fail("stortype == EXR_STORAGE_SCANLINE",(char *)0x399,0x182894,pcVar12);
}

Assistant:

static void
doDecodeScan (exr_context_t f, pixels& p, int xs, int ys)
{
    exr_chunk_info_t      cinfo;
    exr_decode_pipeline_t decoder;
    int32_t               scansperchunk;
    exr_attr_box2i_t      dw;
    bool                  first = true;

    EXRCORE_TEST_RVAL (exr_get_data_window (f, 0, &dw));
    EXRCORE_TEST (dw.min.x == IMG_DATA_X * xs);
    EXRCORE_TEST (dw.max.x == IMG_DATA_X * xs + IMG_WIDTH * xs - 1);
    EXRCORE_TEST (dw.min.y == IMG_DATA_Y * ys);
    EXRCORE_TEST (dw.max.y == IMG_DATA_Y * ys + IMG_HEIGHT * ys - 1);

    EXRCORE_TEST_RVAL (exr_get_scanlines_per_chunk (f, 0, &scansperchunk));

    exr_storage_t stortype;
    EXRCORE_TEST_RVAL (exr_get_storage (f, 0, &stortype));
    EXRCORE_TEST (stortype == EXR_STORAGE_SCANLINE);

    //const uint8_t* tmp;
    for (int y = dw.min.y; y <= dw.max.y; y += scansperchunk)
    {
        EXRCORE_TEST_RVAL (exr_read_scanline_chunk_info (f, 0, y, &cinfo));
        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_initialize (f, 0, &cinfo, &decoder));
        }
        else
        {
            EXRCORE_TEST_RVAL (exr_decoding_update (f, 0, &cinfo, &decoder));
        }
        int32_t idxoffset = ((y - dw.min.y) / ys) * p._stride_x;

        for (int c = 0; c < decoder.channel_count; ++c)
        {
            const exr_coding_channel_info_t& curchan = decoder.channels[c];
            void*                            ptr;
            int32_t                          pixelstride;
            int32_t                          linestride;

            if (curchan.height == 0)
            {
                decoder.channels[c].decode_to_ptr     = NULL;
                decoder.channels[c].user_pixel_stride = 0;
                decoder.channels[c].user_line_stride  = 0;
                continue;
            }

            fill_pointers (
                p, curchan, idxoffset, &ptr, &pixelstride, &linestride);

            // make sure the setup has initialized our bytes for us
            EXRCORE_TEST (curchan.user_bytes_per_element == pixelstride);

            decoder.channels[c].decode_to_ptr     = (uint8_t*) ptr;
            decoder.channels[c].user_pixel_stride = pixelstride;
            decoder.channels[c].user_line_stride  = linestride;
        }

        if (first)
        {
            EXRCORE_TEST_RVAL (
                exr_decoding_choose_default_routines (f, 0, &decoder));
        }
        EXRCORE_TEST_RVAL (exr_decoding_run (f, 0, &decoder));

        first = false;
    }
    EXRCORE_TEST_RVAL (exr_decoding_destroy (f, &decoder));
}